

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::NullTypeHandlerBase::AddProperty
          (NullTypeHandlerBase *this,DynamicObject *instance,PropertyId propertyId,Var value,
          PropertyAttributes attributes,PropertyValueInfo *info,PropertyOperationFlags flags,
          SideEffects possibleSideEffects)

{
  bool bVar1;
  ScriptContext *this_00;
  SimpleDictionaryTypeHandler *this_01;
  PropertyRecord *propertyKey;
  SimpleTypeHandler<1UL> *this_02;
  ScriptContext *scriptContext;
  PropertyValueInfo *info_local;
  PropertyAttributes attributes_local;
  Var value_local;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  NullTypeHandlerBase *this_local;
  
  if ((((this->super_DynamicTypeHandler).field_0x15 & 1) == 0) ||
     ((bVar1 = DynamicTypeHandler::ChangeTypeOnProto(), !bVar1 &&
      ((bVar1 = DynamicTypeHandler::GetIsShared(&this->super_DynamicTypeHandler), !bVar1 ||
       (bVar1 = DynamicTypeHandler::IsolatePrototypes(), !bVar1)))))) {
    this_02 = ConvertToSimpleType(this,instance);
    this_local._4_4_ =
         SimpleTypeHandler<1UL>::AddProperty
                   (this_02,instance,propertyId,value,attributes,info,flags,possibleSideEffects);
  }
  else {
    this_00 = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
    this_01 = ConvertToSimpleDictionaryType(this,instance);
    propertyKey = ScriptContext::GetPropertyName(this_00,propertyId);
    this_local._4_4_ =
         SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>::
         AddProperty<Js::PropertyRecord_const*>
                   ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>
                     *)this_01,instance,propertyKey,value,attributes,info,flags,possibleSideEffects)
    ;
  }
  return this_local._4_4_;
}

Assistant:

BOOL NullTypeHandlerBase::AddProperty(DynamicObject* instance, PropertyId propertyId, Var value, PropertyAttributes attributes, PropertyValueInfo* info, PropertyOperationFlags flags, SideEffects possibleSideEffects)
    {
        if (this->isPrototype && (ChangeTypeOnProto() || (GetIsShared() && IsolatePrototypes())))
        {
            ScriptContext* scriptContext = instance->GetScriptContext();
            return ConvertToSimpleDictionaryType(instance)->AddProperty(instance, scriptContext->GetPropertyName(propertyId), value, attributes, info, flags, possibleSideEffects);
        }
        else
        {
            return ConvertToSimpleType(instance)->AddProperty(instance, propertyId, value, attributes, info, flags, possibleSideEffects);
        }
    }